

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_arithm<short>(uint length,short value1,short value2,bool allowTrash)

{
  long lVar1;
  short *psVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  undefined6 in_register_00000012;
  undefined6 in_register_00000032;
  ulong uVar5;
  short *local_a0;
  shared_ptr<short> pv1;
  shared_ptr<short> pv2;
  shared_ptr<short> presult;
  int local_60;
  int local_50;
  
  uVar5 = (ulong)length;
  psVar2 = nosimd::common::malloc<short>(length);
  std::__shared_ptr<short,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<short,void(*)(short*),void>
            ((__shared_ptr<short,(__gnu_cxx::_Lock_policy)2> *)&local_a0,psVar2,
             nosimd::common::free<short>);
  psVar2 = nosimd::common::malloc<short>(length);
  std::__shared_ptr<short,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<short,void(*)(short*),void>
            ((__shared_ptr<short,(__gnu_cxx::_Lock_policy)2> *)
             &pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount,psVar2,
             nosimd::common::free<short>);
  presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       (undefined4)CONCAT71(in_register_00000009,allowTrash);
  psVar2 = nosimd::common::malloc<short>(length + 1);
  std::__shared_ptr<short,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<short,void(*)(short*),void>
            ((__shared_ptr<short,(__gnu_cxx::_Lock_policy)2> *)
             &pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount,psVar2,
             nosimd::common::free<short>);
  *(undefined2 *)
   ((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar5 * 2) = 0x7f;
  nosimd::common::set<short>(value1,local_a0,length);
  nosimd::common::set<short>
            (value2,(short *)pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi,length);
  uVar4 = 0;
  while (uVar5 != uVar4) {
    if ((local_a0[uVar4] != value1) ||
       (lVar1 = uVar4 * 2, uVar4 = uVar4 + 1,
       *(short *)((long)&(pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base + lVar1) != value2)) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
      *(undefined4 *)(puVar3 + 1) = 0x1a;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::add<short>
            (local_a0,(short *)pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi,
             (short *)pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar4 = 0;
  while (uVar5 != uVar4) {
    lVar1 = uVar4 * 2;
    uVar4 = uVar4 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar1) != (short)(value2 + value1)) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
      *(undefined4 *)(puVar3 + 1) = 0x22;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  local_60 = (int)CONCAT62(in_register_00000012,value2);
  nosimd::arithmetic::sub<short>
            (local_a0,(short *)pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi,
             (short *)pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar4 = 0;
  while (uVar5 != uVar4) {
    lVar1 = uVar4 * 2;
    uVar4 = uVar4 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar1) != (short)(value1 - value2)) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
      *(undefined4 *)(puVar3 + 1) = 0x2a;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  local_50 = (int)CONCAT62(in_register_00000032,value1);
  nosimd::arithmetic::mul<short>
            (local_a0,(short *)pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi,
             (short *)pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar4 = 0;
  while (uVar5 != uVar4) {
    lVar1 = uVar4 * 2;
    uVar4 = uVar4 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar1) != (short)(local_60 * local_50)) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
      *(undefined4 *)(puVar3 + 1) = 0x32;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       local_60 * local_50;
  nosimd::arithmetic::div<short>
            (local_a0,(short *)pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi,
             (short *)pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar4 = 0;
  while (uVar5 != uVar4) {
    lVar1 = uVar4 * 2;
    uVar4 = uVar4 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar1) != value1 / value2) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
      *(undefined4 *)(puVar3 + 1) = 0x3a;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::addC<short>
            (local_a0,value2,
             (short *)pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar4 = 0;
  while (uVar5 != uVar4) {
    lVar1 = uVar4 * 2;
    uVar4 = uVar4 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar1) != (short)(value2 + value1)) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
      *(undefined4 *)(puVar3 + 1) = 0x43;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::subC<short>
            (local_a0,value2,
             (short *)pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar4 = 0;
  while (uVar5 != uVar4) {
    lVar1 = uVar4 * 2;
    uVar4 = uVar4 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar1) != (short)(value1 - value2)) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
      *(undefined4 *)(puVar3 + 1) = 0x4b;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::subCRev<short>
            (local_a0,value2,
             (short *)pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar4 = 0;
  while (uVar5 != uVar4) {
    lVar1 = uVar4 * 2;
    uVar4 = uVar4 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar1) != (short)(value2 - value1)) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
      *(undefined4 *)(puVar3 + 1) = 0x53;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::mulC<short>
            (local_a0,value2,
             (short *)pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar4 = 0;
  while (uVar5 != uVar4) {
    lVar1 = uVar4 * 2;
    uVar4 = uVar4 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar1) !=
        (short)presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       ) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
      *(undefined4 *)(puVar3 + 1) = 0x5b;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divC<short>
            (local_a0,value2,
             (short *)pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar4 = 0;
  while (uVar5 != uVar4) {
    lVar1 = uVar4 * 2;
    uVar4 = uVar4 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar1) != value1 / value2) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
      *(undefined4 *)(puVar3 + 1) = 99;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divCRev<short>
            (local_a0,value2,
             (short *)pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar4 = 0;
  while (uVar5 != uVar4) {
    lVar1 = uVar4 * 2;
    uVar4 = uVar4 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar1) != value2 / value1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
      *(undefined4 *)(puVar3 + 1) = 0x6b;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  if (((char)presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi == '\0'
      ) && (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + uVar5 * 2) != 0x7f)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
    *(undefined4 *)(puVar3 + 1) = 0x70;
    *(uint *)((long)puVar3 + 0xc) = length;
    __cxa_throw(puVar3,&Exception::typeinfo,0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}